

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConfigInstanceIdentifierSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigInstanceIdentifierSyntax,slang::syntax::ConfigInstanceIdentifierSyntax_const&>
          (BumpAllocator *this,ConfigInstanceIdentifierSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  ConfigInstanceIdentifierSyntax *pCVar13;
  
  pCVar13 = (ConfigInstanceIdentifierSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConfigInstanceIdentifierSyntax *)this->endPtr < pCVar13 + 1) {
    pCVar13 = (ConfigInstanceIdentifierSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pCVar13 + 1);
  }
  (pCVar13->name).info = (args->name).info;
  SVar11 = (args->super_SyntaxNode).kind;
  uVar12 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar7 = (args->dot).kind;
  uVar8 = (args->dot).field_0x2;
  NVar9.raw = (args->dot).numFlags.raw;
  uVar10 = (args->dot).rawLen;
  TVar3 = (args->name).kind;
  uVar4 = (args->name).field_0x2;
  NVar5.raw = (args->name).numFlags.raw;
  uVar6 = (args->name).rawLen;
  (pCVar13->dot).info = (args->dot).info;
  (pCVar13->name).kind = TVar3;
  (pCVar13->name).field_0x2 = uVar4;
  (pCVar13->name).numFlags = (NumericTokenFlags)NVar5.raw;
  (pCVar13->name).rawLen = uVar6;
  (pCVar13->super_SyntaxNode).previewNode = pSVar2;
  (pCVar13->dot).kind = TVar7;
  (pCVar13->dot).field_0x2 = uVar8;
  (pCVar13->dot).numFlags = (NumericTokenFlags)NVar9.raw;
  (pCVar13->dot).rawLen = uVar10;
  (pCVar13->super_SyntaxNode).kind = SVar11;
  *(undefined4 *)&(pCVar13->super_SyntaxNode).field_0x4 = uVar12;
  (pCVar13->super_SyntaxNode).parent = pSVar1;
  return pCVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }